

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
jsoncons::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,byte_string_view *bstr)

{
  ostream *poVar1;
  byte_string_view *in_RSI;
  ostream *in_RDI;
  uint8_t b;
  const_iterator __end2;
  const_iterator __begin2;
  byte_string_view *__range2;
  bool first;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ss;
  string local_1d8 [32];
  int local_1b8;
  byte local_1b1;
  byte *local_1b0;
  byte *local_1a8;
  byte_string_view *local_1a0;
  byte local_195;
  long local_188 [47];
  byte_string_view *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  std::ios_base::flags((ios_base *)((long)local_188 + *(long *)(local_188[0] + -0x18)),_S_hex);
  std::ios::fill((char)local_188 + (char)*(undefined8 *)(local_188[0] + -0x18));
  local_195 = 1;
  local_1a0 = local_10;
  local_1a8 = byte_string_view::begin(local_10);
  local_1b0 = byte_string_view::end(local_1a0);
  for (; poVar1 = local_8, local_1a8 != local_1b0; local_1a8 = local_1a8 + 1) {
    local_1b1 = *local_1a8;
    if ((local_195 & 1) == 0) {
      std::operator<<((ostream *)local_188,',');
    }
    else {
      local_195 = 0;
    }
    local_1b8 = (int)std::setw(2);
    poVar1 = std::operator<<((ostream *)local_188,(_Setw)local_1b8);
    std::ostream::operator<<(poVar1,(uint)local_1b1);
  }
  std::__cxx11::ostringstream::str();
  std::operator<<(poVar1,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  return local_8;
}

Assistant:

std::basic_ostream<CharT>& operator<<(std::basic_ostream<CharT>& os, const byte_string_view& bstr)
        {
            std::basic_ostringstream<CharT> ss;
            ss.flags(std::ios::hex);
            ss.fill('0');

            bool first = true;
            for (auto b : bstr)
            {
                if (first)
                {
                    first = false;
                }
                else 
                {
                    ss << ',';
                }
                ss << std::setw(2) << static_cast<int>(b);
            }
            os << ss.str();
            return os;
        }